

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
EncodedDescriptorDatabaseExtraTest_FindNameOfFileContainingSymbol_Test::TestBody
          (EncodedDescriptorDatabaseExtraTest_FindNameOfFileContainingSymbol_Test *this)

{
  bool bVar1;
  int iVar2;
  uint32_t *puVar3;
  Arena *pAVar4;
  DescriptorProto *pDVar5;
  void *pvVar6;
  char *pcVar7;
  char *in_R9;
  string local_760;
  AssertHelper local_740;
  Message local_738;
  allocator<char> local_729;
  string local_728;
  bool local_701;
  undefined1 local_700 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_6d0;
  Message local_6c8;
  allocator<char> local_6b9;
  string local_6b8;
  bool local_691;
  undefined1 local_690 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_660;
  Message local_658;
  allocator<char> local_649;
  string local_648;
  bool local_621;
  undefined1 local_620 [8];
  AssertionResult gtest_ar__3;
  Message local_608;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_5d0;
  Message local_5c8;
  allocator<char> local_5b9;
  string local_5b8;
  bool local_591;
  undefined1 local_590 [8];
  AssertionResult gtest_ar__2;
  Message local_578;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_540;
  Message local_538;
  allocator<char> local_529;
  string local_528;
  bool local_501;
  undefined1 local_500 [8];
  AssertionResult gtest_ar__1;
  Message local_4e8;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_4b0;
  Message local_4a8;
  allocator<char> local_499;
  string local_498;
  bool local_471;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_;
  string filename;
  EncodedDescriptorDatabase db;
  string local_3f8;
  undefined1 local_3d8 [8];
  string data2;
  string data1;
  FileDescriptorProto file2b;
  undefined1 local_290 [8];
  FileDescriptorProto file2a;
  FileDescriptorProto file1;
  EncodedDescriptorDatabaseExtraTest_FindNameOfFileContainingSymbol_Test *this_local;
  
  file1.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)((long)&file2a.field_0 + 0xe0));
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_290);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)((long)&data1.field_2 + 8));
  puVar3 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&file1.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)((long)&file2a.field_0 + 0xe0));
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &file1.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,"foo.proto",
             pAVar4);
  puVar3 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&file1.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 2;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)((long)&file2a.field_0 + 0xe0));
  internal::ArenaStringPtr::Set(&file1.field_0._impl_.name_,"foo",pAVar4);
  pDVar5 = FileDescriptorProto::add_message_type
                     ((FileDescriptorProto *)((long)&file2a.field_0 + 0xe0));
  puVar3 = internal::HasBits<1>::operator[](&(pDVar5->field_0)._impl_._has_bits_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)pDVar5);
  internal::ArenaStringPtr::Set(&(pDVar5->field_0)._impl_.name_,"Foo",pAVar4);
  puVar3 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&file2a.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)local_290);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &file2a.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,"bar.proto"
             ,pAVar4);
  puVar3 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&file2b.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 2;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)((long)&data1.field_2 + 8));
  internal::ArenaStringPtr::Set(&file2b.field_0._impl_.name_,"bar",pAVar4);
  pDVar5 = FileDescriptorProto::add_message_type((FileDescriptorProto *)((long)&data1.field_2 + 8));
  puVar3 = internal::HasBits<1>::operator[](&(pDVar5->field_0)._impl_._has_bits_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)pDVar5);
  internal::ArenaStringPtr::Set(&(pDVar5->field_0)._impl_.name_,"Bar",pAVar4);
  protobuf::MessageLite::SerializeAsString_abi_cxx11_
            ((string *)((long)&data2.field_2 + 8),(MessageLite *)((long)&file2a.field_0 + 0xe0));
  protobuf::MessageLite::SerializeAsString_abi_cxx11_
            (&local_3f8,(MessageLite *)((long)&data1.field_2 + 8));
  protobuf::MessageLite::SerializeAsString_abi_cxx11_
            ((string *)
             &db.files_to_delete_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(MessageLite *)local_290);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8,
                 &local_3f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &db.files_to_delete_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &db.files_to_delete_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_3f8);
  EncodedDescriptorDatabase::EncodedDescriptorDatabase
            ((EncodedDescriptorDatabase *)((long)&filename.field_2 + 8));
  pvVar6 = (void *)std::__cxx11::string::data();
  iVar2 = std::__cxx11::string::size();
  EncodedDescriptorDatabase::Add
            ((EncodedDescriptorDatabase *)((long)&filename.field_2 + 8),pvVar6,iVar2);
  pvVar6 = (void *)std::__cxx11::string::data();
  iVar2 = std::__cxx11::string::size();
  EncodedDescriptorDatabase::Add
            ((EncodedDescriptorDatabase *)((long)&filename.field_2 + 8),pvVar6,iVar2);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"foo.Foo",&local_499);
  local_471 = EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
                        ((EncodedDescriptorDatabase *)((long)&filename.field_2 + 8),&local_498,
                         (string *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_470,&local_471,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_470,
               (AssertionResult *)"db.FindNameOfFileContainingSymbol(\"foo.Foo\", &filename)",
               "false","true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1e0,pcVar7);
    testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4b0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_4e0,"\"foo.proto\"","filename",(char (*) [10])0x1e1d402,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1e1,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"foo.Foo.Blah",&local_529)
  ;
  local_501 = EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
                        ((EncodedDescriptorDatabase *)((long)&filename.field_2 + 8),&local_528,
                         (string *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_500,&local_501,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_500,
               (AssertionResult *)"db.FindNameOfFileContainingSymbol(\"foo.Foo.Blah\", &filename)",
               "false","true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1e2,pcVar7);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_570,"\"foo.proto\"","filename",(char (*) [10])0x1e1d402,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1e3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_578);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"bar.Bar",&local_5b9);
  local_591 = EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
                        ((EncodedDescriptorDatabase *)((long)&filename.field_2 + 8),&local_5b8,
                         (string *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_590,&local_591,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_590,
               (AssertionResult *)"db.FindNameOfFileContainingSymbol(\"bar.Bar\", &filename)",
               "false","true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1e4,pcVar7);
    testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_600,"\"bar.proto\"","filename",(char (*) [10])0x1e1d7ee,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1e5,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"foo",&local_649);
  bVar1 = EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
                    ((EncodedDescriptorDatabase *)((long)&filename.field_2 + 8),&local_648,
                     (string *)&gtest_ar_.message_);
  local_621 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_620,&local_621,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_620,
               (AssertionResult *)"db.FindNameOfFileContainingSymbol(\"foo\", &filename)","true",
               "false",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_660,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1e6,pcVar7);
    testing::internal::AssertHelper::operator=(&local_660,&local_658);
    testing::internal::AssertHelper::~AssertHelper(&local_660);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"bar",&local_6b9);
  bVar1 = EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
                    ((EncodedDescriptorDatabase *)((long)&filename.field_2 + 8),&local_6b8,
                     (string *)&gtest_ar_.message_);
  local_691 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_690,&local_691,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_690,
               (AssertionResult *)"db.FindNameOfFileContainingSymbol(\"bar\", &filename)","true",
               "false",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1e7,pcVar7);
    testing::internal::AssertHelper::operator=(&local_6d0,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"baz.Baz",&local_729);
  bVar1 = EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
                    ((EncodedDescriptorDatabase *)((long)&filename.field_2 + 8),&local_728,
                     (string *)&gtest_ar_.message_);
  local_701 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_700,&local_701,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(&local_738);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_760,(internal *)local_700,
               (AssertionResult *)"db.FindNameOfFileContainingSymbol(\"baz.Baz\", &filename)","true"
               ,"false",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_740,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1e8,pcVar7);
    testing::internal::AssertHelper::operator=(&local_740,&local_738);
    testing::internal::AssertHelper::~AssertHelper(&local_740);
    std::__cxx11::string::~string((string *)&local_760);
    testing::Message::~Message(&local_738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  EncodedDescriptorDatabase::~EncodedDescriptorDatabase
            ((EncodedDescriptorDatabase *)((long)&filename.field_2 + 8));
  std::__cxx11::string::~string((string *)local_3d8);
  std::__cxx11::string::~string((string *)(data2.field_2._M_local_buf + 8));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)((long)&data1.field_2 + 8));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_290);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)((long)&file2a.field_0 + 0xe0));
  return;
}

Assistant:

TEST(EncodedDescriptorDatabaseExtraTest, FindNameOfFileContainingSymbol) {
  // Create two files, one of which is in two parts.
  FileDescriptorProto file1, file2a, file2b;
  file1.set_name("foo.proto");
  file1.set_package("foo");
  file1.add_message_type()->set_name("Foo");
  file2a.set_name("bar.proto");
  file2b.set_package("bar");
  file2b.add_message_type()->set_name("Bar");

  // Normal serialization allows our optimization to kick in.
  std::string data1 = file1.SerializeAsString();

  // Force out-of-order serialization to test slow path.
  std::string data2 = file2b.SerializeAsString() + file2a.SerializeAsString();

  // Create EncodedDescriptorDatabase containing both files.
  EncodedDescriptorDatabase db;
  db.Add(data1.data(), data1.size());
  db.Add(data2.data(), data2.size());

  // Test!
  std::string filename;
  EXPECT_TRUE(db.FindNameOfFileContainingSymbol("foo.Foo", &filename));
  EXPECT_EQ("foo.proto", filename);
  EXPECT_TRUE(db.FindNameOfFileContainingSymbol("foo.Foo.Blah", &filename));
  EXPECT_EQ("foo.proto", filename);
  EXPECT_TRUE(db.FindNameOfFileContainingSymbol("bar.Bar", &filename));
  EXPECT_EQ("bar.proto", filename);
  EXPECT_FALSE(db.FindNameOfFileContainingSymbol("foo", &filename));
  EXPECT_FALSE(db.FindNameOfFileContainingSymbol("bar", &filename));
  EXPECT_FALSE(db.FindNameOfFileContainingSymbol("baz.Baz", &filename));
}